

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::StringLifting::run::StringApplier::create(StringApplier *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  
  p_Var1 = *(_func_int **)(in_RSI + 0x130);
  pp_Var2 = (_func_int **)operator_new(0x140);
  pp_Var2[1] = (_func_int *)0x0;
  pp_Var2[2] = (_func_int *)(pp_Var2 + 4);
  pp_Var2[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 4) = 0;
  *(undefined1 *)(pp_Var2 + 10) = 0;
  pp_Var2[0xb] = (_func_int *)0x0;
  pp_Var2[0xc] = (_func_int *)0x0;
  pp_Var2[0x21] = (_func_int *)0x0;
  pp_Var2[0x22] = (_func_int *)0x0;
  pp_Var2[0x23] = (_func_int *)0x0;
  pp_Var2[0x24] = (_func_int *)0x0;
  pp_Var2[0x25] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR__WalkerPass_01074ea8;
  pp_Var2[0x26] = p_Var1;
  *(undefined1 *)(pp_Var2 + 0x27) = 0;
  (this->super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>).
  super_Pass._vptr_Pass = pp_Var2;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<StringApplier>(parent);
      }